

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

dynamic_string * __thiscall crnlib::dynamic_string::trim(dynamic_string *this)

{
  ushort uVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  dynamic_string *pdVar5;
  ulong uVar6;
  uint len;
  uint start;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = this->m_len;
  uVar6 = (ulong)uVar1;
  pcVar2 = this->m_pStr;
  uVar7 = 0;
  while ((uVar8 = uVar6, uVar6 != uVar7 &&
         (iVar4 = isspace((int)pcVar2[uVar7]), uVar8 = uVar7, iVar4 != 0))) {
    uVar7 = uVar7 + 1;
  }
  start = (uint)uVar8;
  uVar3 = uVar1 - start;
  do {
    len = uVar3;
    uVar6 = uVar6 - 1;
    if ((long)uVar6 <= (long)(int)start) break;
    iVar4 = isspace((int)pcVar2[uVar6]);
    uVar3 = len - 1;
  } while (iVar4 != 0);
  pdVar5 = crop(this,start,len);
  return pdVar5;
}

Assistant:

dynamic_string& dynamic_string::trim()
    {
        int s, e;
        for (s = 0; s < (int)m_len; s++)
        {
            if (!isspace(m_pStr[s]))
            {
                break;
            }
        }

        for (e = m_len - 1; e > s; e--)
        {
            if (!isspace(m_pStr[e]))
            {
                break;
            }
        }

        return crop(s, e - s + 1);
    }